

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenFactory.cpp
# Opt level: O2

ParenToken * __thiscall
xercesc_4_0::TokenFactory::createParenthesis(TokenFactory *this,Token *token,int noGroups)

{
  ParenToken *this_00;
  
  this_00 = (ParenToken *)XMemory::operator_new(0x28,this->fMemoryManager);
  ParenToken::ParenToken(this_00,T_PAREN,token,noGroups,this->fMemoryManager);
  BaseRefVectorOf<xercesc_4_0::Token>::addElement
            (&this->fTokens->super_BaseRefVectorOf<xercesc_4_0::Token>,(Token *)this_00);
  return this_00;
}

Assistant:

ParenToken* TokenFactory::createParenthesis(Token* const token,
                                            const int noGroups) {

    ParenToken* tmpTok = new (fMemoryManager) ParenToken(Token::T_PAREN, token, noGroups, fMemoryManager);

    fTokens->addElement(tmpTok);
    return tmpTok;
}